

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptRegExp::GetSpecialPropertyName
          (JavascriptRegExp *this,uint32 index,JavascriptString **propertyName,
          ScriptContext *requestContext)

{
  ThreadConfiguration *pTVar1;
  uint uVar2;
  BOOL BVar3;
  PropertyString *pPVar4;
  PropertyId *pPVar5;
  PropertyId *pPVar6;
  bool bVar7;
  
  uVar2 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x40])();
  BVar3 = 0;
  if (index < uVar2) {
    pTVar1 = (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
                ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig;
    bVar7 = pTVar1->m_ES2018RegExDotAll != false;
    pPVar5 = specialPropertyIdsWithoutDotAll;
    if (bVar7) {
      pPVar5 = specialPropertyIdsAll;
    }
    pPVar6 = specialPropertyIdsWithoutDotAllOrUnicode;
    if (bVar7) {
      pPVar6 = specialPropertyIdsWithoutUnicode;
    }
    if (pTVar1->m_ES6Unicode != false) {
      pPVar6 = pPVar5;
    }
    pPVar4 = ScriptContext::GetPropertyString(requestContext,pPVar6[index]);
    *propertyName = &pPVar4->super_JavascriptString;
    BVar3 = 1;
  }
  return BVar3;
}

Assistant:

BOOL JavascriptRegExp::GetSpecialPropertyName(uint32 index, JavascriptString ** propertyName, ScriptContext * requestContext)
    {
        uint length = GetSpecialPropertyCount();

        if (index < length)
        {
            *propertyName = requestContext->GetPropertyString(GetSpecialPropertyIdsInlined()[index]);
            return true;
        }
        return false;
    }